

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O2

void __thiscall Rml::ElementEffects::ReloadEffectsData(ElementEffects *this)

{
  undefined8 *puVar1;
  long lVar2;
  DecoratorEntry *decorator;
  undefined8 *puVar3;
  FilterEntry *filter;
  long lVar4;
  bool bVar5;
  String local_60;
  UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL> local_40;
  
  if (this->effects_data_dirty == true) {
    this->effects_data_dirty = false;
    local_60._M_dataplus._M_p = (pointer)&this->decorators;
    local_60._M_string_length = (size_type)&this->mask_images;
    bVar5 = false;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 8) {
      puVar3 = *(undefined8 **)((long)&local_60._M_dataplus._M_p + lVar4);
      puVar1 = (undefined8 *)puVar3[1];
      for (puVar3 = (undefined8 *)*puVar3; puVar3 != puVar1; puVar3 = puVar3 + 4) {
        if (puVar3[2] != 0) {
          (**(code **)(*(long *)*puVar3 + 0x18))();
        }
        lVar2 = (**(code **)(*(long *)*puVar3 + 0x10))
                          ((long *)*puVar3,this->element,*(undefined4 *)(puVar3 + 3));
        puVar3[2] = lVar2;
        bVar5 = (bool)(bVar5 | lVar2 == 0);
      }
    }
    if (bVar5) {
      Element::GetAddress_abi_cxx11_(&local_60,this->element,false,true);
      Log::Message(LT_WARNING,"Could not generate decorator element data: %s",
                   local_60._M_dataplus._M_p);
      ::std::__cxx11::string::~string((string *)&local_60);
    }
    local_60._M_dataplus._M_p = (pointer)&this->filters;
    local_60._M_string_length = (size_type)&this->backdrop_filters;
    bVar5 = false;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 8) {
      puVar3 = *(undefined8 **)((long)&local_60._M_dataplus._M_p + lVar4);
      puVar1 = (undefined8 *)puVar3[1];
      for (puVar3 = (undefined8 *)*puVar3; puVar3 != puVar1; puVar3 = puVar3 + 4) {
        (**(code **)(*(long *)*puVar3 + 0x10))(&local_40,(long *)*puVar3,this->element);
        UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>::operator=
                  ((UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL> *)(puVar3 + 2),
                   &local_40);
        UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>::~UniqueRenderResource
                  (&local_40);
        bVar5 = (bool)(bVar5 | puVar3[3] == 0);
      }
    }
    if (bVar5) {
      Element::GetAddress_abi_cxx11_(&local_60,this->element,false,true);
      Log::Message(LT_WARNING,"Could not compile filter on element: %s",local_60._M_dataplus._M_p);
      ::std::__cxx11::string::~string((string *)&local_60);
    }
  }
  return;
}

Assistant:

void ElementEffects::ReloadEffectsData()
{
	if (effects_data_dirty)
	{
		effects_data_dirty = false;

		bool decorator_data_failed = false;
		for (DecoratorEntryList* list : {&decorators, &mask_images})
		{
			for (DecoratorEntry& decorator : *list)
			{
				if (decorator.decorator_data)
					decorator.decorator->ReleaseElementData(decorator.decorator_data);

				decorator.decorator_data = decorator.decorator->GenerateElementData(element, decorator.paint_area);
				if (!decorator.decorator_data)
					decorator_data_failed = true;
			}
		}

		if (decorator_data_failed)
			Log::Message(Log::LT_WARNING, "Could not generate decorator element data: %s", element->GetAddress().c_str());

		bool filter_compile_failed = false;
		for (FilterEntryList* list : {&filters, &backdrop_filters})
		{
			for (FilterEntry& filter : *list)
			{
				filter.compiled = filter.filter->CompileFilter(element);
				if (!filter.compiled)
					filter_compile_failed = true;
			}
		}

		if (filter_compile_failed)
			Log::Message(Log::LT_WARNING, "Could not compile filter on element: %s", element->GetAddress().c_str());
	}
}